

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestP4.cxx
# Opt level: O3

void __thiscall
cmCTestP4::SetP4Options
          (cmCTestP4 *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *CommandOptions)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  cmCTest *pcVar3;
  string opts;
  string p4;
  string client;
  string local_b0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  this_00 = &this->P4Options;
  if ((this->P4Options).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (this->P4Options).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    pcVar2 = (this->super_cmCTestGlobalVC).super_cmCTestVC.CommandLineTool._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_70,pcVar2,
               pcVar2 + (this->super_cmCTestGlobalVC).super_cmCTestVC.CommandLineTool.
                        _M_string_length);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string&>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
               &local_70);
    pcVar3 = (this->super_cmCTestGlobalVC).super_cmCTestVC.CTest;
    paVar1 = &local_b0.field_2;
    local_b0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"P4Client","");
    cmCTest::GetCTestConfiguration(&local_50,pcVar3,&local_b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != paVar1) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    if (local_50._M_string_length != 0) {
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const(&)[3]>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
                 (char (*) [3])0x96e97f);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(this_00,&local_50);
    }
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[3]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
               (char (*) [3])"-L");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[3]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
               (char (*) [3])0x9165b8);
    pcVar3 = (this->super_cmCTestGlobalVC).super_cmCTestVC.CTest;
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"P4Options","");
    cmCTest::GetCTestConfiguration(&local_b0,pcVar3,&local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    cmSystemTools::ParseArguments
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_90,&local_b0);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    _M_range_insert<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
               (this->P4Options).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,local_90._M_dataplus._M_p,
               local_90._M_string_length);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != paVar1) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(CommandOptions,this_00);
  return;
}

Assistant:

void cmCTestP4::SetP4Options(std::vector<std::string>& CommandOptions)
{
  if (this->P4Options.empty()) {
    std::string p4 = this->CommandLineTool;
    this->P4Options.emplace_back(p4);

    // The CTEST_P4_CLIENT variable sets the P4 client used when issuing
    // Perforce commands, if it's different from the default one.
    std::string client = this->CTest->GetCTestConfiguration("P4Client");
    if (!client.empty()) {
      this->P4Options.emplace_back("-c");
      this->P4Options.push_back(client);
    }

    // Set the message language to be English, in case the P4 admin
    // has localized them
    this->P4Options.emplace_back("-L");
    this->P4Options.emplace_back("en");

    // The CTEST_P4_OPTIONS variable adds additional Perforce command line
    // options before the main command
    std::string opts = this->CTest->GetCTestConfiguration("P4Options");
    cm::append(this->P4Options, cmSystemTools::ParseArguments(opts));
  }

  CommandOptions = this->P4Options;
}